

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredmesh.cc
# Opt level: O2

void __thiscall gvr::ColoredMesh::savePLY(ColoredMesh *this,char *name,bool all,ply_encoding enc)

{
  uint __fd;
  size_t __n;
  void *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX_00;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX_01;
  void *__buf_06;
  void *__buf_07;
  void *extraout_RDX_02;
  void *pvVar1;
  void *__buf_08;
  void *__buf_09;
  void *extraout_RDX_03;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  int __fd_00;
  string *name_00;
  int i;
  long lVar2;
  long lVar3;
  allocator local_291;
  string local_290;
  PLYWriter ply;
  
  PLYWriter::PLYWriter(&ply);
  PLYWriter::open(&ply,name,enc);
  Model::setOriginToPLY((Model *)this,&ply);
  std::__cxx11::string::string((string *)&local_290,"vertex",&local_291);
  PLYWriter::addElement(&ply,&local_290,(long)(this->super_Mesh).super_PointCloud.n);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_290,"x",&local_291);
  PLYWriter::addProperty(&ply,&local_290,ply_float32);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_290,"y",&local_291);
  PLYWriter::addProperty(&ply,&local_290,ply_float32);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_290,"z",&local_291);
  PLYWriter::addProperty(&ply,&local_290,ply_float32);
  std::__cxx11::string::~string((string *)&local_290);
  if ((this->super_Mesh).super_PointCloud.scanprop == (float *)0x0) {
    if (!all) goto LAB_0012fd6c;
  }
  else {
    std::__cxx11::string::string((string *)&local_290,"scan_size",&local_291);
    PLYWriter::addProperty(&ply,&local_290,ply_float32);
    std::__cxx11::string::~string((string *)&local_290);
    if (!all) goto LAB_0012fd6c;
    std::__cxx11::string::string((string *)&local_290,"scan_error",&local_291);
    PLYWriter::addProperty(&ply,&local_290,ply_float32);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string((string *)&local_290,"scan_conf",&local_291);
    PLYWriter::addProperty(&ply,&local_290,ply_float32);
    std::__cxx11::string::~string((string *)&local_290);
  }
  if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
    std::__cxx11::string::string((string *)&local_290,"sx",&local_291);
    PLYWriter::addProperty(&ply,&local_290,ply_float32);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string((string *)&local_290,"sy",&local_291);
    PLYWriter::addProperty(&ply,&local_290,ply_float32);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string((string *)&local_290,"sz",&local_291);
    PLYWriter::addProperty(&ply,&local_290,ply_float32);
    std::__cxx11::string::~string((string *)&local_290);
  }
  std::__cxx11::string::string((string *)&local_290,"nx",&local_291);
  PLYWriter::addProperty(&ply,&local_290,ply_float32);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_290,"ny",&local_291);
  PLYWriter::addProperty(&ply,&local_290,ply_float32);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_290,"nz",&local_291);
  PLYWriter::addProperty(&ply,&local_290,ply_float32);
  std::__cxx11::string::~string((string *)&local_290);
LAB_0012fd6c:
  std::__cxx11::string::string((string *)&local_290,"diffuse_red",&local_291);
  PLYWriter::addProperty(&ply,&local_290,ply_uint8);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_290,"diffuse_green",&local_291);
  PLYWriter::addProperty(&ply,&local_290,ply_uint8);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_290,"diffuse_blue",&local_291);
  PLYWriter::addProperty(&ply,&local_290,ply_uint8);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_290,"face",&local_291);
  PLYWriter::addElement(&ply,&local_290,(long)(this->super_Mesh).n);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_290,"vertex_indices",&local_291);
  name_00 = &local_290;
  __n = 6;
  PLYWriter::addProperty(&ply,name_00,ply_uint8,ply_uint32);
  std::__cxx11::string::~string((string *)&local_290);
  lVar3 = 0;
  lVar2 = 0;
  pvVar1 = extraout_RDX;
  do {
    __fd_00 = (int)name_00;
    if ((this->super_Mesh).super_PointCloud.n <= lVar2) {
      lVar3 = 0;
      for (lVar2 = 0; lVar2 < (this->super_Mesh).n; lVar2 = lVar2 + 1) {
        PLYWriter::writeListSize(&ply,3);
        PLYWriter::write(&ply,*(int *)((long)(this->super_Mesh).triangle + lVar3),__buf_10,__n);
        PLYWriter::write(&ply,*(int *)((long)(this->super_Mesh).triangle + lVar3 + 4),__buf_11,__n);
        __fd = *(uint *)((long)(this->super_Mesh).triangle + lVar3 + 8);
        name_00 = (string *)(ulong)__fd;
        PLYWriter::write(&ply,__fd,__buf_12,__n);
        lVar3 = lVar3 + 0xc;
      }
      PLYWriter::close(&ply,(int)name_00);
      PLYWriter::~PLYWriter(&ply);
      return;
    }
    PLYWriter::write(&ply,__fd_00,pvVar1,__n);
    PLYWriter::write(&ply,__fd_00,__buf,__n);
    PLYWriter::write(&ply,__fd_00,__buf_00,__n);
    if ((this->super_Mesh).super_PointCloud.scanprop == (float *)0x0) {
      pvVar1 = __buf_01;
      if (all) goto LAB_0012ff23;
    }
    else {
      PLYWriter::write(&ply,__fd_00,__buf_01,__n);
      pvVar1 = __buf_02;
      if (all) {
        PLYWriter::write(&ply,__fd_00,__buf_02,__n);
        PLYWriter::write(&ply,__fd_00,__buf_03,__n);
        pvVar1 = extraout_RDX_00;
LAB_0012ff23:
        if ((this->super_Mesh).super_PointCloud.scanpos != (float *)0x0) {
          PLYWriter::write(&ply,__fd_00,pvVar1,__n);
          PLYWriter::write(&ply,__fd_00,__buf_04,__n);
          PLYWriter::write(&ply,__fd_00,__buf_05,__n);
          pvVar1 = extraout_RDX_01;
        }
        PLYWriter::write(&ply,__fd_00,pvVar1,__n);
        PLYWriter::write(&ply,__fd_00,__buf_06,__n);
        PLYWriter::write(&ply,__fd_00,__buf_07,__n);
        pvVar1 = extraout_RDX_02;
      }
    }
    PLYWriter::write(&ply,(uint)this->rgb[lVar3],pvVar1,__n);
    PLYWriter::write(&ply,(uint)this->rgb[lVar3 + 1],__buf_08,__n);
    name_00 = (string *)(ulong)this->rgb[lVar3 + 2];
    PLYWriter::write(&ply,(uint)this->rgb[lVar3 + 2],__buf_09,__n);
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 3;
    pvVar1 = extraout_RDX_03;
  } while( true );
}

Assistant:

void ColoredMesh::savePLY(const char *name, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  ply.open(name, enc);

  // define data

  setOriginToPLY(ply);

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  if (all)
  {
    ply.addProperty("nx", ply_float32);
    ply.addProperty("ny", ply_float32);
    ply.addProperty("nz", ply_float32);
  }

  ply.addProperty("diffuse_red", ply_uint8);
  ply.addProperty("diffuse_green", ply_uint8);
  ply.addProperty("diffuse_blue", ply_uint8);

  ply.addElement("face", getTriangleCount());
  ply.addProperty("vertex_indices", ply_uint8, ply_uint32);

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }

    if (all)
    {
      ply.write(getNormalComp(i, 0));
      ply.write(getNormalComp(i, 1));
      ply.write(getNormalComp(i, 2));
    }

    ply.write(getColorComp(i, 0));
    ply.write(getColorComp(i, 1));
    ply.write(getColorComp(i, 2));
  }

  for (int i=0; i<getTriangleCount(); i++)
  {
    ply.writeListSize(3);
    ply.write(getTriangleIndex(i, 0));
    ply.write(getTriangleIndex(i, 1));
    ply.write(getTriangleIndex(i, 2));
  }

  ply.close();
}